

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  KFLOAT32 *pKVar1;
  KFLOAT32 KVar2;
  float fVar3;
  TMATRIX DR;
  TMATRIX curOrientationMatrix;
  
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix(&DR);
  if (this->m_bQuaxAxisSet == true) {
    computeDRMatrix_asQuat(this,&DR,totalTimeSinceReset);
  }
  else {
    computeDRMatrix(this,&DR,totalTimeSinceReset);
  }
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
            (&curOrientationMatrix,&DR,&this->m_initOrientationMatrix);
  matrixToHPR_new(&curOrientationMatrix,OrientationOut);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  fVar3 = (float)*pKVar1;
  if (-3.1415927 <= fVar3) {
    if (3.1415927 < fVar3) {
      fVar3 = fVar3 + -6.2831855;
    }
  }
  else {
    fVar3 = fVar3 + 6.2831855;
  }
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  *pKVar1 = (KFLOAT32)fVar3;
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  KVar2 = checkAngleP(*pKVar1);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  *pKVar1 = KVar2;
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  fVar3 = (float)*pKVar1;
  if (-3.1415927 <= fVar3) {
    if (3.1415927 < fVar3) {
      fVar3 = fVar3 + -6.2831855;
    }
  }
  else {
    fVar3 = fVar3 + 6.2831855;
  }
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  *pKVar1 = (KFLOAT32)fVar3;
  computeRotationAxis(this,&curOrientationMatrix);
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset  )
{
    // compute the DR matrix
    TMATRIX DR;
    if (m_bQuaxAxisSet)
        computeDRMatrix_asQuat( DR, totalTimeSinceReset );
    else
        computeDRMatrix( DR, totalTimeSinceReset );

    TMATRIX curOrientationMatrix = DR * m_initOrientationMatrix;
    //TMATRIX curOrientationMatrix = m_initOrientationMatrix;

    matrixToHPR_new( curOrientationMatrix, OrientationOut );
    //matrixToHPR( curOrientationMatrix, m_curOrientation );
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[1] = checkAngleP(OrientationOut[1]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);

    computeRotationAxis(curOrientationMatrix);
}